

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_closure(JSContext *ctx,JSValue bfunc,JSVarRef **cur_var_refs,JSStackFrame *sf)

{
  ushort uVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  JSAtom name;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  JSValueUnion b;
  JSValue JVar7;
  JSValue JVar8;
  
  b = bfunc.u;
  JVar7 = JS_NewObjectClass(ctx,(uint)*(ushort *)
                                       ((long)func_kind_to_class_id +
                                       (ulong)(*(ushort *)((long)b.ptr + 0x19) >> 3 & 6)));
  if ((int)JVar7.tag != 6) {
    bfunc = js_closure2(ctx,JVar7,(JSFunctionBytecode *)b.ptr,cur_var_refs,sf);
    uVar5 = bfunc.tag;
    JVar2 = bfunc.u;
    if ((uVar5 & 0xffffffff) != 6) {
      name = 0x2f;
      if (*(JSAtom *)((long)b.ptr + 0x2c) != 0) {
        name = *(JSAtom *)((long)b.ptr + 0x2c);
      }
      js_function_set_properties(ctx,bfunc,name,(uint)*(uint16_t *)((long)b.ptr + 0x44));
      uVar1 = *(ushort *)((long)b.ptr + 0x19);
      if ((uVar1 & 0x10) == 0) {
        if ((uVar1 & 1) != 0) {
          if ((int)bfunc.tag == -1) {
            *(byte *)((long)JVar2.ptr + 5U) = *(byte *)((long)JVar2.ptr + 5U) | 0x10;
          }
          JS_DefineAutoInitProperty(ctx,bfunc,0x3b,JS_AUTOINIT_ID_PROTOTYPE,(void *)0x0,2);
        }
      }
      else {
        lVar6 = 0x280;
        if ((~uVar1 & 0x30) == 0) {
          lVar6 = 800;
        }
        JVar7.tag = *(int64_t *)((long)&ctx->class_proto->tag + lVar6);
        JVar7.u.ptr = ((JSValueUnion *)((long)&ctx->class_proto->u + lVar6))->ptr;
        JVar7 = JS_NewObjectProto(ctx,JVar7);
        if ((int)JVar7.tag == 6) goto LAB_00130c55;
        JS_DefinePropertyValue(ctx,bfunc,0x3b,JVar7,2);
      }
      uVar4 = (ulong)JVar2.ptr & 0xffffffff00000000;
      uVar3 = (ulong)JVar2.ptr & 0xffffffff;
      goto LAB_00130c61;
    }
  }
LAB_00130c55:
  JS_FreeValue(ctx,bfunc);
  uVar5 = 6;
  uVar3 = 0;
  uVar4 = 0;
LAB_00130c61:
  JVar8.u.ptr = (void *)(uVar3 | uVar4);
  JVar8.tag = uVar5;
  return JVar8;
}

Assistant:

static JSValue js_closure(JSContext *ctx, JSValue bfunc,
                          JSVarRef **cur_var_refs,
                          JSStackFrame *sf)
{
    JSFunctionBytecode *b;
    JSValue func_obj;
    JSAtom name_atom;

    b = JS_VALUE_GET_PTR(bfunc);
    func_obj = JS_NewObjectClass(ctx, func_kind_to_class_id[b->func_kind]);
    if (JS_IsException(func_obj)) {
        JS_FreeValue(ctx, bfunc);
        return JS_EXCEPTION;
    }
    func_obj = js_closure2(ctx, func_obj, b, cur_var_refs, sf);
    if (JS_IsException(func_obj)) {
        /* bfunc has been freed */
        goto fail;
    }
    name_atom = b->func_name;
    if (name_atom == JS_ATOM_NULL)
        name_atom = JS_ATOM_empty_string;
    js_function_set_properties(ctx, func_obj, name_atom,
                               b->defined_arg_count);

    if (b->func_kind & JS_FUNC_GENERATOR) {
        JSValue proto;
        int proto_class_id;
        /* generators have a prototype field which is used as
           prototype for the generator object */
        if (b->func_kind == JS_FUNC_ASYNC_GENERATOR)
            proto_class_id = JS_CLASS_ASYNC_GENERATOR;
        else
            proto_class_id = JS_CLASS_GENERATOR;
        proto = JS_NewObjectProto(ctx, ctx->class_proto[proto_class_id]);
        if (JS_IsException(proto))
            goto fail;
        JS_DefinePropertyValue(ctx, func_obj, JS_ATOM_prototype, proto,
                               JS_PROP_WRITABLE);
    } else if (b->has_prototype) {
        /* add the 'prototype' property: delay instantiation to avoid
           creating cycles for every javascript function. The prototype
           object is created on the fly when first accessed */
        JS_SetConstructorBit(ctx, func_obj, TRUE);
        JS_DefineAutoInitProperty(ctx, func_obj, JS_ATOM_prototype,
                                  JS_AUTOINIT_ID_PROTOTYPE, NULL,
                                  JS_PROP_WRITABLE);
    }
    return func_obj;
 fail:
    /* bfunc is freed when func_obj is freed */
    JS_FreeValue(ctx, func_obj);
    return JS_EXCEPTION;
}